

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

bool __thiscall Lexer::ReadIdent(Lexer *this,string *out)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  uchar yych;
  char *start;
  char *p;
  string *out_local;
  Lexer *this_local;
  
  pbVar2 = (byte *)this->ofs_;
  start = (char *)pbVar2;
  if ((""[(int)(uint)*pbVar2] & 0x80) == 0) {
    this->last_token_ = (char *)pbVar2;
    this_local._7_1_ = false;
  }
  else {
    do {
      pcVar3 = start + 1;
      pbVar1 = (byte *)(start + 1);
      start = pcVar3;
    } while ((""[(int)(uint)*pbVar1] & 0x80) != 0);
    std::__cxx11::string::assign((char *)out,(ulong)pbVar2);
    this->last_token_ = (char *)pbVar2;
    this->ofs_ = pcVar3;
    EatWhitespace(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::ReadIdent(string* out) {
  const char* p = ofs_;
  const char* start;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0, 128, 128,   0, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0,   0,   0,   0,   0,   0, 
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128,   0,   0,   0,   0, 128, 
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
		  0,   0,   0,   0,   0,   0,   0,   0, 
	};
	yych = *p;
	if (yybm[0+yych] & 128) {
		goto yy95;
	}
	++p;
	{
      last_token_ = start;
      return false;
    }
yy95:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy95;
	}
	{
      out->assign(start, p - start);
      break;
    }
}

  }
  last_token_ = start;
  ofs_ = p;
  EatWhitespace();
  return true;
}